

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O1

void __thiscall cmFileCopier::~cmFileCopier(cmFileCopier *this)

{
  ~cmFileCopier(this);
  operator_delete(this,0xa8);
  return;
}

Assistant:

virtual ~cmFileCopier() {}